

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalUnixMakefileGenerator3.cxx
# Opt level: O1

void __thiscall
cmGlobalUnixMakefileGenerator3::cmGlobalUnixMakefileGenerator3
          (cmGlobalUnixMakefileGenerator3 *this,cmake *cm)

{
  _Rb_tree_header *p_Var1;
  
  cmGlobalCommonGenerator::cmGlobalCommonGenerator(&this->super_cmGlobalCommonGenerator,cm);
  (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator._vptr_cmGlobalGenerator =
       (_func_int **)&PTR__cmGlobalUnixMakefileGenerator3_00671a40;
  (this->IncludeDirective)._M_dataplus._M_p = (pointer)&(this->IncludeDirective).field_2;
  (this->IncludeDirective)._M_string_length = 0;
  (this->IncludeDirective).field_2._M_local_buf[0] = '\0';
  (this->EmptyRuleHackDepends)._M_dataplus._M_p = (pointer)&(this->EmptyRuleHackDepends).field_2;
  (this->EmptyRuleHackDepends)._M_string_length = 0;
  (this->EmptyRuleHackDepends).field_2._M_local_buf[0] = '\0';
  (this->EmptyRuleHackCommand)._M_dataplus._M_p = (pointer)&(this->EmptyRuleHackCommand).field_2;
  (this->EmptyRuleHackCommand)._M_string_length = 0;
  (this->EmptyRuleHackCommand).field_2._M_local_buf[0] = '\0';
  p_Var1 = &(this->ProgressMap)._M_t._M_impl.super__Rb_tree_header;
  (this->ProgressMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->ProgressMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->ProgressMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->ProgressMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->ProgressMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(this->DirectoryTargetsMap)._M_t._M_impl.super__Rb_tree_header;
  (this->DirectoryTargetsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->DirectoryTargetsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->DirectoryTargetsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->DirectoryTargetsMap)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->DirectoryTargetsMap)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.ForceUnixPaths = true;
  std::__cxx11::string::_M_replace
            ((ulong)&(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                     FindMakeProgramFile,0,
             (char *)(this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.
                     FindMakeProgramFile._M_string_length,0x56e639);
  (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.ToolSupportsColor = true;
  (this->super_cmGlobalCommonGenerator).super_cmGlobalGenerator.UseLinkScript = true;
  this->CommandDatabase = (cmGeneratedFileStream *)0x0;
  std::__cxx11::string::_M_replace
            ((ulong)&this->IncludeDirective,0,(char *)(this->IncludeDirective)._M_string_length,
             0x5629b7);
  this->DefineWindowsNULL = false;
  this->PassMakeflags = false;
  this->UnixCD = true;
  return;
}

Assistant:

cmGlobalUnixMakefileGenerator3::cmGlobalUnixMakefileGenerator3(cmake* cm)
  : cmGlobalCommonGenerator(cm)
{
  // This type of makefile always requires unix style paths
  this->ForceUnixPaths = true;
  this->FindMakeProgramFile = "CMakeUnixFindMake.cmake";
  this->ToolSupportsColor = true;

#if defined(_WIN32) || defined(__VMS)
  this->UseLinkScript = false;
#else
  this->UseLinkScript = true;
#endif
  this->CommandDatabase = CM_NULLPTR;

  this->IncludeDirective = "include";
  this->DefineWindowsNULL = false;
  this->PassMakeflags = false;
  this->UnixCD = true;
}